

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O3

void __thiscall f8n::db::Connection::Initialize(Connection *this,uint cache)

{
  bool bVar1;
  char cVar2;
  long *plVar3;
  uint uVar4;
  long *plVar5;
  long *zSql;
  char cVar6;
  string cacheSize;
  string __str;
  long local_50;
  long lStack_48;
  long *local_40;
  uint local_38;
  long local_30 [2];
  
  cVar6 = '\x01';
  sqlite3_enable_shared_cache(1);
  sqlite3_busy_timeout(this->connection,10000);
  sqlite3_exec(this->connection,"PRAGMA optimize",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
  sqlite3_exec(this->connection,"PRAGMA synchronous=NORMAL",(sqlite3_callback)0x0,(void *)0x0,
               (char **)0x0);
  sqlite3_exec(this->connection,"PRAGMA page_size=4096",(sqlite3_callback)0x0,(void *)0x0,
               (char **)0x0);
  sqlite3_exec(this->connection,"PRAGMA auto_vacuum=0",(sqlite3_callback)0x0,(void *)0x0,
               (char **)0x0);
  sqlite3_exec(this->connection,"PRAGMA journal_mode=WAL",(sqlite3_callback)0x0,(void *)0x0,
               (char **)0x0);
  if (cache != 0) {
    if (0x27 < cache) {
      uVar4 = cache >> 2;
      cVar2 = '\x04';
      do {
        cVar6 = cVar2;
        if (uVar4 < 100) {
          cVar6 = cVar6 + -2;
          goto LAB_001c229b;
        }
        if (uVar4 < 1000) {
          cVar6 = cVar6 + -1;
          goto LAB_001c229b;
        }
        if (uVar4 < 10000) goto LAB_001c229b;
        bVar1 = 99999 < uVar4;
        uVar4 = uVar4 / 10000;
        cVar2 = cVar6 + '\x04';
      } while (bVar1);
      cVar6 = cVar6 + '\x01';
    }
LAB_001c229b:
    local_40 = local_30;
    std::__cxx11::string::_M_construct((ulong)&local_40,cVar6);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_40,local_38,cache >> 2);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x1e9cbe);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_50 = *plVar5;
      lStack_48 = plVar3[3];
      zSql = &local_50;
    }
    else {
      local_50 = *plVar5;
      zSql = (long *)*plVar3;
    }
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
    sqlite3_exec(this->connection,(char *)zSql,(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
    if (zSql != &local_50) {
      operator_delete(zSql,local_50 + 1);
    }
  }
  sqlite3_exec(this->connection,"PRAGMA case_sensitive_like=0",(sqlite3_callback)0x0,(void *)0x0,
               (char **)0x0);
  sqlite3_exec(this->connection,"PRAGMA count_changes=0",(sqlite3_callback)0x0,(void *)0x0,
               (char **)0x0);
  sqlite3_exec(this->connection,"PRAGMA legacy_file_format=OFF",(sqlite3_callback)0x0,(void *)0x0,
               (char **)0x0);
  sqlite3_exec(this->connection,"PRAGMA temp_store=MEMORY",(sqlite3_callback)0x0,(void *)0x0,
               (char **)0x0);
  return;
}

Assistant:

void Connection::Initialize(unsigned int cache) {
    sqlite3_enable_shared_cache(1);
    sqlite3_busy_timeout(this->connection, 10000);

    sqlite3_exec(this->connection, "PRAGMA optimize", nullptr, nullptr, nullptr);           // Optimize the database when applicable
    sqlite3_exec(this->connection, "PRAGMA synchronous=NORMAL", nullptr, nullptr, nullptr); // NORMAL useful for auto-checkpointing with WAL
    sqlite3_exec(this->connection, "PRAGMA page_size=4096", nullptr, nullptr, nullptr);	    // According to windows standard page size
    sqlite3_exec(this->connection, "PRAGMA auto_vacuum=0", nullptr, nullptr, nullptr);	    // No autovaccum.
    sqlite3_exec(this->connection, "PRAGMA journal_mode=WAL", nullptr, nullptr, nullptr);   // Allow reading while writing (write-ahead-logging)

    if (cache != 0) {
        // Divide by 4 to since the page_size is 4096
        // Total cache is the same as page_size*cache_size
        cache = cache / 4;
        std::string cacheSize("PRAGMA cache_size=" + std::to_string(cache));
        sqlite3_exec(this->connection,cacheSize.c_str(), nullptr, nullptr, nullptr); // size * 1.5kb = 6Mb cache
    }

    sqlite3_exec(this->connection, "PRAGMA case_sensitive_like=0", nullptr, nullptr, nullptr);   // More speed if case insensitive
    sqlite3_exec(this->connection, "PRAGMA count_changes=0", nullptr, nullptr, nullptr);         // If set it counts changes on SQL UPDATE. More speed when not.
    sqlite3_exec(this->connection, "PRAGMA legacy_file_format=OFF", nullptr, nullptr, nullptr);  // No reason to be backwards compatible :)
    sqlite3_exec(this->connection, "PRAGMA temp_store=MEMORY", nullptr, nullptr, nullptr);       // MEMORY, not file. More speed.
}